

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O0

int __thiscall
ON_HatchPattern::SetHatchLines(ON_HatchPattern *this,size_t count,ON_HatchLine *lines)

{
  uint uVar1;
  HatchFillType HVar2;
  int iVar3;
  ON_HatchLine *lines_local;
  size_t count_local;
  ON_HatchPattern *this_local;
  
  if ((count == 0) || (lines == (ON_HatchLine *)0x0)) {
    uVar1 = ON_ClassArray<ON_HatchLine>::UnsignedCount(&this->m_lines);
    if (uVar1 != 0) {
      ON_ModelComponent::IncrementContentVersionNumber(&this->super_ON_ModelComponent);
    }
    ON_ClassArray<ON_HatchLine>::Destroy(&this->m_lines);
    HVar2 = FillType(this);
    if (HVar2 == Lines) {
      SetFillType(this,Solid);
    }
  }
  else {
    ON_ClassArray<ON_HatchLine>::SetCount(&this->m_lines,0);
    ON_ClassArray<ON_HatchLine>::Append(&this->m_lines,(int)count,lines);
    ON_ModelComponent::IncrementContentVersionNumber(&this->super_ON_ModelComponent);
    SetFillType(this,Lines);
  }
  iVar3 = ON_ClassArray<ON_HatchLine>::Count(&this->m_lines);
  return iVar3;
}

Assistant:

int ON_HatchPattern::SetHatchLines(
  size_t count,
  const ON_HatchLine* lines
  )
{

  if (count > 0 && nullptr != lines )
  {
    m_lines.SetCount(0);
    m_lines.Append((int)count, lines);
    IncrementContentVersionNumber();
    SetFillType(ON_HatchPattern::HatchFillType::Lines);
  }
  else
  {
    if (0 != m_lines.UnsignedCount())
      IncrementContentVersionNumber();
    m_lines.Destroy();
    if ( ON_HatchPattern::HatchFillType::Lines == FillType())
      SetFillType(ON_HatchPattern::HatchFillType::Solid);
  }
  return m_lines.Count();
}